

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemo.cpp
# Opt level: O1

void demo3(void)

{
  IMLE<1,_1,_FastLinearExpert> imleObj;
  Param PStack_408;
  IMLE<1,_1,_FastLinearExpert> local_370;
  
  IMLE<1,_1,_FastLinearExpert>::Param::Param(&PStack_408);
  PStack_408.Psi0.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.
  array[0] = (PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>)
             (DenseStorage<double,_1,_1,_1,_0>)0x3fb999999999999a;
  PStack_408.sigma0 = 1.0;
  PStack_408.p0 = 0.2;
  IMLE<1,_1,_FastLinearExpert>::IMLE(&local_370,&PStack_408,0x800);
  doubleCos1D_train<IMLE<1,1,FastLinearExpert>>(&local_370,2000);
  doubleCos1D_eval<IMLE<1,1,FastLinearExpert>>(&local_370);
  IMLE<1,_1,_FastLinearExpert>::~IMLE(&local_370);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)PStack_408.defaultSave._M_dataplus._M_p != &PStack_408.defaultSave.field_2) {
    operator_delete(PStack_408.defaultSave._M_dataplus._M_p);
  }
  return;
}

Assistant:

void demo3()
{
    const int d = 1;    //Input dimension
    const int D = 1;    //Output dimension

    //      IMLE Parameters
    IMLE<d,D>::Param param;
    param.Psi0 = IMLE<d,D>::X::Constant(0.1);
    param.sigma0 = 1.0;
    param.p0 = 0.2;

    // IMLE object
    IMLE<d,D> imleObj(param);

    doubleCos1D_train( imleObj );
    doubleCos1D_eval( imleObj );
}